

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-dice.c
# Opt level: O3

_Bool dice_test_values(dice_t *dice,int base,int dice_count,int sides,int bonus)

{
  return bonus == dice->m && (sides == dice->y && (dice_count == dice->x && base == dice->b));
}

Assistant:

bool dice_test_values(const dice_t *dice, int base, int dice_count, int sides,
		int bonus)
{
	bool success = true;
	success &= dice->b == base;
	success &= dice->x == dice_count;
	success &= dice->y == sides;
	success &= dice->m == bonus;
	return success;
}